

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::on_oct
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  uint uVar1;
  bin_writer<3> f;
  bool bVar2;
  int iVar3;
  int_writer<unsigned_long,fmt::v5::basic_format_specs<char>> *in_RDI;
  basic_format_specs<char> *in_stack_00000020;
  int in_stack_0000002c;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_00000030;
  string_view in_stack_00000038;
  int num_digits;
  undefined8 in_stack_00000058;
  
  iVar3 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
          int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::count_digits<3u>(in_RDI);
  bVar2 = core_format_specs::has((core_format_specs *)(*(long *)(in_RDI + 8) + 0xc),8);
  if ((bVar2) && (*(int *)(*(long *)(in_RDI + 8) + 0xc) <= iVar3)) {
    uVar1 = *(uint *)(in_RDI + 0x1c);
    *(uint *)(in_RDI + 0x1c) = uVar1 + 1;
    in_RDI[(ulong)uVar1 + 0x18] = (int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>)0x30;
  }
  get_prefix((int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *)0x12b6fe);
  f._8_8_ = in_stack_00000058;
  f.abs_value = (unsigned_type)this;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
            (in_stack_00000030,in_stack_0000002c,in_stack_00000038,in_stack_00000020,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>();
      if (spec.has(HASH_FLAG) &&
          spec.precision <= num_digits) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<3>{abs_value, num_digits});
    }